

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::file_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::file_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<float> *original_costs,
            double cost_constant)

{
  double dVar1;
  init_policy_type iVar2;
  context *ctx;
  context *ctx_00;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  void *pvVar6;
  bool bVar7;
  unique_ptr<float[],_std::default_delete<float[]>_> P;
  unique_ptr<float[],_std::default_delete<float[]>_> uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  rep rVar13;
  long lVar14;
  result_status rVar15;
  ulong uVar16;
  random_engine *rng;
  int iVar17;
  long lVar18;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  float *in_R9;
  undefined1 auVar19 [16];
  float delta;
  float fVar21;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  double dVar22;
  double dVar23;
  undefined1 extraout_var [60];
  undefined1 auVar26 [64];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float theta;
  undefined1 in_ZMM4 [64];
  undefined1 auVar30 [64];
  undefined1 in_register_00001344 [12];
  string_view filename;
  bit_array x;
  default_cost_type<float> norm_costs;
  compute_order compute;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  slv;
  file_observer obs;
  bit_array_impl local_3a8;
  float local_394;
  double local_390;
  double local_388;
  double local_380;
  default_cost_type<float> *local_378;
  double local_370;
  ulong local_368;
  int local_35c;
  cost_type local_358;
  double local_348;
  compute_order local_340;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  local_308;
  undefined1 local_288 [8];
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Stack_280;
  filebuf local_278 [240];
  ios_base local_188 [264];
  ap_file_observer local_80;
  undefined1 auVar20 [64];
  undefined1 extraout_var_00 [60];
  
  auVar24 = ZEXT1664(ZEXT816(0) << 0x40);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar24;
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = auVar24;
  __return_storage_ptr__->strings = (string_buffer_ptr)auVar24._0_16_;
  (__return_storage_ptr__->method)._M_len = SUB168(auVar24._16_16_,0);
  (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar24._16_16_,8);
  (__return_storage_ptr__->affected_vars).names =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )auVar24._32_24_;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar24._56_8_;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  auVar30 = ZEXT1664(in_ZMM4._0_16_);
  local_370 = cost_constant;
  bit_array_impl::bit_array_impl(&local_3a8,variables);
  ctx = this->m_ctx;
  normalize_costs<float,baryonyx::itm::default_cost_type<float>>
            ((itm *)&local_358,ctx,original_costs,this->m_rng,variables);
  local_388 = (ctx->parameters).kappa_step;
  local_390 = (ctx->parameters).kappa_max;
  dVar23 = (ctx->parameters).alpha;
  dVar1 = (ctx->parameters).delta;
  theta = (float)(ctx->parameters).theta;
  if (0.0 <= dVar1) {
    delta = (float)dVar1;
  }
  else {
    ctx_00 = this->m_ctx;
    local_288._0_4_ = theta;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar19 = SUB6416(ZEXT464(0x7f7fffff),0);
    }
    else {
      auVar25 = ZEXT464(0x7f7fffff);
      uVar16 = 0;
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      do {
        auVar19 = vandps_avx(ZEXT416((uint)*(float *)((long)local_358.linear_elements._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + uVar16 * 4)),auVar28);
        auVar30 = ZEXT1664(auVar19);
        uVar3 = vcmpps_avx512vl(auVar19,auVar25._0_16_,1);
        uVar4 = vcmpps_avx512vl(ZEXT416((uint)*(float *)((long)local_358.linear_elements._M_t.
                                                                                                                              
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + uVar16 * 4)),ZEXT816(0) << 0x40,4);
        bVar5 = (byte)uVar4 & (byte)uVar3;
        auVar20._16_48_ = auVar24._16_48_;
        auVar20._0_16_ = auVar25._0_16_;
        auVar24._4_60_ = auVar20._4_60_;
        auVar24._0_4_ = (uint)(bVar5 & 1) * auVar19._0_4_ + (uint)!(bool)(bVar5 & 1) * auVar25._0_4_
        ;
        auVar19 = auVar24._0_16_;
        auVar25 = ZEXT1664(auVar19);
        uVar16 = uVar16 + 1;
      } while ((uint)variables != uVar16);
    }
    local_308.super_debug_logger<false>.ofs._0_4_ = auVar19._0_4_;
    auVar19 = vfnmadd132ss_fma(auVar19,auVar19,ZEXT416((uint)local_288._0_4_));
    local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = auVar19._0_4_;
    info<float,float,float>
              ((baryonyx *)ctx_00,(context *)"    - delta={} (min normalized cost:{} / theta: {})\n"
               ,(char *)&local_340,(float *)&local_308,(float *)local_288,in_R9);
    delta = local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_;
  }
  local_380 = (ctx->parameters).pushing_k_factor;
  local_348 = (ctx->parameters).pushing_objective_amplifier;
  local_368 = (ulong)(ctx->parameters).w;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::solver_inequalities_01coeff
            (&local_308,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_358,constraints);
  compute_order::compute_order(&local_340,(ctx->parameters).order,variables);
  dVar1 = (this->m_ctx->parameters).init_policy_random;
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar2 = (ctx->parameters).init_policy;
  if (iVar2 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)&local_3a8,original_costs,variables,0);
  }
  else {
    if (iVar2 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_3a8;
      x_optimistic = (bit_array_impl *)local_288;
    }
    else {
      if (iVar2 != optimistic_solve) goto LAB_00379bc4;
      rng = this->m_rng;
      x_pessimistic = (bit_array_impl *)local_288;
      x_optimistic = &local_3a8;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_00379bc4:
  local_378 = original_costs;
  if (local_3a8.m_size != 0) {
    iVar17 = 0;
    do {
      dVar22 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar22 < dVar1) {
        bit_array_impl::invert(&local_3a8,iVar17);
      }
      iVar17 = iVar17 + 1;
    } while (local_3a8.m_size != iVar17);
  }
  if (_Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)_Stack_280._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  dVar1 = (ctx->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  file_observer::file_observer
            ((file_observer *)local_288,filename,local_308.m,local_308.n,(ctx->parameters).limit);
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar13;
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar13;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array>
            (&local_340,&local_308,(bit_array *)&local_3a8);
  local_394 = (float)local_388;
  local_388 = (double)CONCAT44(local_388._4_4_,(float)local_390);
  local_390 = (double)CONCAT44(local_390._4_4_,(float)dVar23);
  auVar24 = ZEXT1664(CONCAT124(in_register_00001344,(float)dVar1));
  local_35c = variables;
  if ((ctx->parameters).limit == 0) {
    bVar9 = false;
  }
  else {
    iVar17 = 0x7fffffff;
    lVar18 = 0;
    bVar9 = false;
    do {
      fVar27 = auVar24._0_4_;
      iVar10 = compute_order::
               run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                         (&local_340,&local_308,(bit_array *)&local_3a8,this->m_rng,fVar27,delta,
                          theta);
      uVar8._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)local_308.pi;
      P._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)local_308.P;
      details::pi_file_observer::make_observation<float>
                ((pi_file_observer *)local_288,&local_308.ap,
                 (float *)local_308.P._M_t.
                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl,
                 (float *)local_308.pi._M_t.
                          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl);
      details::ap_file_observer::make_observation<float>
                (&local_80,&local_308.ap,
                 (float *)P._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl,
                 (float *)uVar8._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                          _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl);
      if (iVar10 == 0) {
        dVar23 = default_cost_type<float>::results(local_378,(bit_array *)&local_3a8,local_370);
        store_if_better(this,(bit_array *)&local_3a8,dVar23,lVar18);
        bVar9 = true;
        iVar17 = 0;
        bVar7 = false;
LAB_00379dcd:
        auVar24 = ZEXT464((uint)fVar27);
      }
      else {
        if (iVar10 < iVar17) {
          store_if_better(this,(bit_array *)&local_3a8,iVar10,lVar18);
          iVar17 = iVar10;
        }
        if ((long)local_368 < lVar18) {
          auVar25._0_4_ = powf((float)iVar10 / (float)local_308.m,local_390._0_4_);
          auVar25._4_60_ = extraout_var;
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)fVar27),auVar25._0_16_,ZEXT416((uint)local_394));
          auVar24 = ZEXT1664(auVar19);
        }
        else {
          auVar24 = ZEXT464((uint)fVar27);
        }
        rVar15 = kappa_max_reached;
        fVar27 = auVar24._0_4_;
        if (local_388._0_4_ < fVar27) {
LAB_00379e3e:
          __return_storage_ptr__->status = rVar15;
          bVar7 = false;
        }
        else {
          lVar14 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar14;
          dVar23 = (this->m_ctx->parameters).time_limit;
          bVar7 = true;
          if (dVar23 <= 0.0) goto LAB_00379dcd;
          rVar15 = time_limit_reached;
          auVar24 = ZEXT464((uint)fVar27);
          if (dVar23 < (double)(lVar14 - (this->m_begin).__d.__r) / 1000000000.0) goto LAB_00379e3e;
        }
      }
    } while ((bVar7) && (lVar18 = lVar18 + 1, lVar18 != (ctx->parameters).limit));
  }
  if (bVar9) {
    if (0 < (ctx->parameters).pushes_limit) {
      fVar27 = (float)local_380;
      local_380 = (double)CONCAT44(local_380._4_4_,(float)local_348);
      iVar17 = 0;
      iVar10 = 0;
      do {
        fVar21 = auVar24._0_4_;
        iVar11 = compute_order::
                 push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                           (&local_340,&local_308,(bit_array *)&local_3a8,this->m_rng,
                            fVar21 * fVar27,delta,theta,local_380._0_4_);
        if (iVar11 == 0) {
          dVar23 = default_cost_type<float>::results(local_378,(bit_array *)&local_3a8,local_370);
          store_if_better(this,(bit_array *)&local_3a8,dVar23,
                          (long)~((ctx->parameters).pushing_iteration_limit * iVar10));
        }
        lVar18 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar18;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = (this->m_ctx->parameters).time_limit;
        auVar19._0_8_ = (double)(lVar18 - (this->m_begin).__d.__r) / 1000000000.0;
        auVar19._8_8_ = auVar30._8_8_;
        uVar3 = vcmppd_avx512vl(auVar29,ZEXT816(0),6);
        uVar16 = vcmppd_avx512vl(auVar29,auVar19,1);
        uVar16 = ((byte)uVar3 & 3) & uVar16;
        local_368 = CONCAT62(local_368._2_6_,(short)uVar16);
        if ((uVar16 & 1) == 0) {
          auVar24 = ZEXT464((uint)fVar21);
          if (0 < (ctx->parameters).pushing_iteration_limit) {
            iVar11 = 1;
            do {
              fVar21 = auVar24._0_4_;
              iVar12 = compute_order::
                       run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                                 (&local_340,&local_308,(bit_array *)&local_3a8,this->m_rng,fVar21,
                                  delta,theta);
              if (iVar12 == 0) {
                dVar23 = default_cost_type<float>::results
                                   (local_378,(bit_array *)&local_3a8,local_370);
                store_if_better(this,(bit_array *)&local_3a8,dVar23,
                                (long)((ctx->parameters).pushing_iteration_limit * iVar17 - iVar11))
                ;
                auVar24 = ZEXT464((uint)fVar21);
                break;
              }
              if ((double)(iVar11 + -1) <= (ctx->parameters).w) {
                auVar24 = ZEXT464((uint)fVar21);
              }
              else {
                auVar26._0_4_ = powf((float)iVar12 / (float)local_308.m,local_390._0_4_);
                auVar26._4_60_ = extraout_var_00;
                auVar19 = vfmadd231ss_fma(ZEXT416((uint)fVar21),auVar26._0_16_,
                                          ZEXT416((uint)local_394));
                auVar24 = ZEXT1664(auVar19);
              }
              fVar21 = auVar24._0_4_;
              if (local_388._0_4_ < fVar21) break;
              lVar18 = std::chrono::_V2::steady_clock::now();
              (this->m_end).__d.__r = lVar18;
              dVar23 = (this->m_ctx->parameters).time_limit;
              if ((0.0 < dVar23) &&
                 (dVar23 < (double)(lVar18 - (this->m_begin).__d.__r) / 1000000000.0))
              goto LAB_00379f59;
              auVar24 = ZEXT464((uint)fVar21);
              bVar9 = iVar11 < (ctx->parameters).pushing_iteration_limit;
              iVar11 = iVar11 + 1;
            } while (bVar9);
          }
        }
        else {
LAB_00379f59:
          auVar24 = ZEXT464((uint)fVar21);
        }
        if ((local_368 & 1) != 0) break;
        iVar10 = iVar10 + 1;
        iVar17 = iVar17 + -1;
      } while (iVar10 < (ctx->parameters).pushes_limit);
    }
  }
  else {
    __return_storage_ptr__->status = limit_reached;
  }
  iVar17 = local_35c;
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,iVar17);
  }
  if (local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_basename._M_dataplus._M_p != &local_80.m_basename.field_2) {
    operator_delete(local_80.m_basename._M_dataplus._M_p,
                    local_80.m_basename.field_2._M_allocated_capacity + 1);
  }
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_VTT;
  *(undefined8 *)(local_278 + _VTT[-3] + -8) = _log;
  std::filebuf::~filebuf(local_278);
  std::ios_base::~ios_base(local_188);
  if (local_340.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar6 = (void *)CONCAT44(local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::~solver_inequalities_01coeff(&local_308);
  if ((__uniq_ptr_impl<float,_std::default_delete<float[]>_>)
      local_358.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_358.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      local_3a8.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_3a8.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }